

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_test.c
# Opt level: O2

bool_t zzTest(void)

{
  u32 uVar1;
  bool_t bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  word wVar7;
  word wVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  long lVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  u64 uVar19;
  ulong m;
  ulong n;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  bool bVar23;
  long local_b50;
  size_t local_b48;
  long local_b40;
  word b_1 [8];
  octet combo_state [32];
  word c [8];
  word local_a68 [6];
  long alStack_a38 [2];
  word r [8];
  word b [8];
  word c1 [8];
  word local_8d8 [8];
  octet combo_state_1 [32];
  word r1 [8];
  word a [8];
  
  sVar6 = prngCOMBO_keep();
  if (0x20 < sVar6) {
    return 0;
  }
  uVar1 = utilNonce32();
  prngCOMBOStart(combo_state,uVar1);
  local_b50 = -0x1f5;
  while( true ) {
    local_b50 = local_b50 + 1;
    if (local_b50 == 0) {
      sVar6 = prngCOMBO_keep();
      if (0x20 < sVar6) {
        return 0;
      }
      sVar6 = zzMul_deep(8,8);
      sVar9 = zzSqr_deep(8);
      sVar10 = zzDiv_deep(0x10,8);
      sVar11 = zzMod_deep(0x10,8);
      sVar6 = utilMax(4,sVar6,sVar9,sVar10,sVar11);
      if (0x800 < sVar6) {
        return 0;
      }
      uVar1 = utilNonce32();
      prngCOMBOStart(combo_state_1,uVar1);
      lVar12 = 500;
      while( true ) {
        sVar6 = 2;
        bVar23 = lVar12 == 0;
        lVar12 = lVar12 + -1;
        if (bVar23) break;
        prngCOMBOStepR(combo_state,0x40,combo_state_1);
        prngCOMBOStepR(b_1,0x40,combo_state_1);
        sVar9 = 1;
        while (sVar9 != 9) {
          zzSqr(b,(word *)combo_state,sVar9,a);
          zzMul(c,(word *)combo_state,sVar9,(word *)combo_state,sVar9,a);
          bVar2 = wwEq(b,c,sVar6);
          sVar9 = sVar9 + 1;
          sVar6 = sVar6 + 2;
          if (bVar2 == 0) {
            return 0;
          }
        }
        local_b50 = 2;
        for (sVar6 = 1; sVar6 != 9; sVar6 = sVar6 + 1) {
          b_1[sVar6 + 7] = b_1[sVar6 + 7] + (ulong)(b_1[sVar6 + 7] == 0);
          zzRandMod(r,(word *)combo_state,sVar6,prngCOMBOStepR,combo_state_1);
          sVar9 = 0;
          while (sVar9 != 8) {
            sVar10 = sVar9 + 1;
            zzMul(b,(word *)combo_state,sVar6,b_1,sVar10,a);
            wVar7 = zzAdd2(b,r,sVar6);
            zzAddW2(b + sVar6,sVar10,wVar7);
            zzMod(r1,b,local_b50 + sVar9,(word *)combo_state,sVar6,a);
            bVar2 = wwEq(r,r1,sVar6);
            if (bVar2 == 0) {
              return 0;
            }
            zzDiv(c1,r1,b,local_b50 + sVar9,(word *)combo_state,sVar6,a);
            bVar2 = wwEq(r,r1,sVar6);
            if (bVar2 == 0) {
              return 0;
            }
            bVar2 = wwEq(b_1,c1,sVar10);
            if (bVar2 == 0) {
              return 0;
            }
            lVar21 = sVar9 + 1;
            sVar9 = sVar10;
            if (c1[lVar21] != 0) {
              return 0;
            }
          }
          local_b50 = local_b50 + 1;
        }
        sVar6 = 1;
        while (sVar6 != 9) {
          wVar7 = r[sVar6 - 1];
          wwCopy(b,(word *)combo_state,sVar6);
          wVar8 = zzAddMulW(b,b_1,sVar6,wVar7);
          wVar7 = zzSubMulW(b,b_1,sVar6,wVar7);
          if (wVar8 != wVar7) {
            return 0;
          }
          bVar2 = wwEq(b,(word *)combo_state,sVar6);
          sVar6 = sVar6 + 1;
          if (bVar2 == 0) {
            return 0;
          }
        }
        lVar21 = 2;
        sVar6 = 1;
        while (lVar21 != 10) {
          uVar20 = alStack_a38[lVar21] + (ulong)(alStack_a38[lVar21] == 0);
          wVar7 = zzMulW(b,(word *)combo_state,sVar6,uVar20);
          r[lVar21 + 7] = wVar7;
          sVar9 = sVar6 + 1;
          zzDivW(c,b,sVar9,uVar20);
          bVar2 = wwEq(c,(word *)combo_state,sVar6);
          if (bVar2 == 0) {
            return 0;
          }
          if (c[lVar21 + -1] != 0) {
            return 0;
          }
          r[0] = r[0] % uVar20;
          wVar7 = zzAddW(b,b,sVar9,r[0]);
          b[lVar21] = wVar7;
          wVar7 = zzModW(b,sVar6 + 2,uVar20);
          if (wVar7 != r[0]) {
            return 0;
          }
          wVar7 = uVar20 & 0xffffffff;
          if (wVar7 == 0) {
            wVar7 = 0x100000000;
          }
          r[1] = r[1] % wVar7;
          wVar8 = zzMulW(b,(word *)combo_state,sVar6,wVar7);
          r[lVar21 + 7] = wVar8;
          wVar8 = zzAddW(b,b,sVar9,r[1]);
          b[lVar21] = wVar8;
          wVar7 = zzModW2(b,sVar6 + 2,wVar7);
          lVar21 = lVar21 + 1;
          sVar6 = sVar9;
          if (wVar7 != r[1]) {
            return 0;
          }
        }
      }
      c1[0]._0_4_ = 0xffffffff;
      c1[0]._4_4_ = 0xffffffff;
      c1[1]._0_4_ = 0xffffffff;
      c1[1]._4_4_ = 0xffffffff;
      b_1[0] = 0xffffffffffffffff;
      b_1[1] = 0x8000000000000000;
      zzMul((word *)combo_state,b_1,2,c1,2,a);
      zzDiv(c,r,(word *)combo_state,4,b_1,2,a);
      bVar2 = wwIsZero(r,2);
      if (bVar2 == 0) {
        return 0;
      }
      bVar2 = wwEq(c,c1,2);
      if (bVar2 == 0) {
        return 0;
      }
      if (c[2] != 0) {
        return 0;
      }
      c1[0]._0_4_ = 0xffffffff;
      c1[0]._4_4_ = 0xffffffff;
      c1[1]._0_4_ = 0xffffffff;
      c1[1]._4_4_ = 0xffffffff;
      c1[2] = 0xffffffffffffffff;
      b_1[0] = 0xffffffffffffffff;
      b_1[1] = 0;
      b_1[2] = 0x8000000000000000;
      zzMul((word *)combo_state,b_1,3,c1,3,a);
      zzDiv(c,r,(word *)combo_state,6,b_1,3,a);
      bVar2 = wwIsZero(r,2);
      if (bVar2 == 0) {
        return 0;
      }
      bVar2 = wwEq(c,c1,3);
      if (bVar2 == 0) {
        return 0;
      }
      if (c[3] != 0) {
        return 0;
      }
      sVar6 = prngCOMBO_keep();
      if (0x20 < sVar6) {
        return 0;
      }
      sVar6 = zzPowerMod_deep(8,1);
      sVar9 = zzMulMod_deep(8);
      sVar10 = zzSqrMod_deep(8);
      sVar11 = zzMod_deep(8,8);
      sVar13 = zzJacobi_deep(8,8);
      sVar14 = zzGCD_deep(8,8);
      sVar15 = zzIsCoprime_deep(8,8);
      sVar16 = zzDivMod_deep(8);
      sVar17 = zzInvMod_deep(8);
      sVar18 = zzAlmostInvMod_deep(8);
      sVar6 = utilMax(10,sVar6,sVar9,sVar10,sVar11,sVar13,sVar14,sVar15,sVar16,sVar17,sVar18);
      if (0x800 < sVar6) {
        return 0;
      }
      uVar1 = utilNonce32();
      prngCOMBOStart(r,uVar1);
      wwRepW(b_1,8,0xffffffffffffffff);
      bVar2 = zzIsOdd(b_1,8);
      if (bVar2 == 0) {
        return 0;
      }
      bVar2 = zzIsEven(b_1,8);
      if (bVar2 != 0) {
        return 0;
      }
      bVar2 = zzRandMod(b,b_1,8,prngCOMBOStepR,r);
      if (bVar2 == 0) {
        return 0;
      }
      c[0] = 3;
      zzPowerMod(c1,b,8,c,1,b_1,a);
      zzSqrMod((word *)combo_state,b,b_1,8,a);
      zzMulMod((word *)combo_state,(word *)combo_state,b,b_1,8,a);
      iVar5 = wwCmp(c1,(word *)combo_state,8);
      if (iVar5 != 0) {
        return 0;
      }
      local_b50 = 500;
      while( true ) {
        bVar23 = local_b50 == 0;
        local_b50 = local_b50 + -1;
        if (bVar23) {
          sVar6 = prngCOMBO_keep();
          if (0x20 < sVar6) {
            return 0;
          }
          sVar6 = zzMul_deep(8,8);
          sVar9 = zzGCD_deep(8,8);
          sVar10 = zzLCM_deep(8,8);
          sVar11 = zzExGCD_deep(8,8);
          sVar6 = utilMax(4,sVar6,sVar9,sVar10,sVar11);
          if (0x800 < sVar6) {
            return 0;
          }
          uVar1 = utilNonce32();
          prngCOMBOStart(r1,uVar1);
          local_b40 = 100;
          while (bVar23 = local_b40 != 0, local_b40 = local_b40 + -1, bVar23) {
            prngCOMBOStepR(combo_state,0x40,r1);
            prngCOMBOStepR(b_1,0x40,r1);
            combo_state._0_8_ = combo_state._0_8_ + (ulong)(combo_state._0_8_ == 0);
            if (b_1[0] == 0) {
              b_1[0] = 2;
            }
            local_b48 = 2;
            for (uVar20 = 1; uVar20 != 8; uVar20 = uVar20 + 1) {
              local_b50 = 7;
              m = 1;
              sVar6 = local_b48;
              while( true ) {
                uVar22 = m;
                if (uVar20 < m) {
                  uVar22 = uVar20;
                }
                bVar23 = local_b50 == 0;
                local_b50 = local_b50 + -1;
                if (bVar23) break;
                zzGCD(r,(word *)combo_state,uVar20,b_1,m,a);
                zzLCM(c,(word *)combo_state,uVar20,b_1,m,a);
                zzMul(c1,(word *)combo_state,uVar20,b_1,m,a);
                n = m;
                if (uVar20 < m) {
                  n = uVar20;
                }
                zzMul(b,r,n,c,sVar6,a);
                iVar5 = wwCmp2(c1,sVar6,b,uVar22 + sVar6);
                if (iVar5 != 0) {
                  return 0;
                }
                zzExGCD(r,c,local_a68,(word *)combo_state,uVar20,b_1,m,a);
                zzMul(c1,c,m,(word *)combo_state,uVar20,a);
                zzMul(b,local_a68,uVar20,b_1,m,a);
                zzSub2(c1,b,sVar6);
                iVar5 = wwCmp2(c1,sVar6,r,n);
                m = m + 1;
                sVar6 = sVar6 + 1;
                if (iVar5 != 0) {
                  return 0;
                }
              }
              local_b48 = local_b48 + 1;
            }
          }
          sVar6 = prngCOMBO_keep();
          if (0x20 < sVar6) {
            return 0;
          }
          sVar6 = zzRed_deep(8);
          sVar9 = zzRedCrand_deep(8);
          sVar10 = zzRedBarrStart_deep(8);
          sVar11 = zzRedBarr_deep(8);
          sVar13 = zzRedMont_deep(8);
          sVar14 = zzRedCrandMont_deep(8);
          sVar6 = utilMax(6,sVar6,sVar9,sVar10,sVar11,sVar13,sVar14);
          if (0x800 < sVar6) {
            return 0;
          }
          uVar1 = utilNonce32();
          prngCOMBOStart(r,uVar1);
          local_b50 = -0x1f5;
          while( true ) {
            local_b50 = local_b50 + 1;
            if (local_b50 == 0) {
              sVar6 = prngCOMBO_keep();
              if (0x20 < sVar6) {
                return 0;
              }
              sVar6 = zzSqr_deep(8);
              sVar9 = zzSqrt_deep(8);
              sVar10 = zzJacobi_deep(0x10,8);
              sVar6 = utilMax(3,sVar6,sVar9,sVar10);
              if (0x800 < sVar6) {
                return 0;
              }
              uVar1 = utilNonce32();
              prngCOMBOStart(combo_state,uVar1);
              lVar12 = -0x1f5;
              while (lVar12 = lVar12 + 1, lVar12 != 0) {
                prngCOMBOStepR(c,0x40,combo_state);
                zzSqr(b,c,8,a);
                prngCOMBOStepR(c1,0x40,combo_state);
                c1[0]._0_4_ = (uint)c1[0] | 1;
                iVar5 = zzJacobi(b,0x10,c1,8,a);
                if (iVar5 == -1) {
                  return 0;
                }
              }
              lVar12 = -500;
              do {
                if (lVar12 == 0) {
                  return 1;
                }
                prngCOMBOStepR(c,0x40,combo_state);
                zzSqr(b,c,8,a);
                zzSqrt(c1,b,0x10,a);
                bVar2 = wwEq(c,c1,8);
                if (bVar2 == 0) {
                  return 0;
                }
                zzAddW2(b,0x10,1);
                zzSqrt(c1,b,0x10,a);
                bVar2 = wwEq(c,c1,8);
                if (bVar2 == 0) {
                  return 0;
                }
                bVar2 = wwIsZero(c,8);
                if (bVar2 == 0) {
                  zzSubW2(b,0x10,2);
                  zzSqrt(c1,b,0x10,a);
                  bVar2 = wwEq(c,c1,8);
                  if (bVar2 != 0) {
                    return 0;
                  }
                  bVar2 = zzIsSumWEq(c,c1,8,1);
                  if (bVar2 == 0) {
                    return 0;
                  }
                }
                lVar12 = lVar12 + 1;
              } while( true );
            }
            prngCOMBOStepR(b_1,0x40,r);
            prngCOMBOStepR(b,0x80,r);
            b_1[7] = b_1[7] + (b_1[7] == 0);
            wwCopy(c,b,0x10);
            zzRed(c,b_1,8,a);
            zzRedBarrStart((word *)combo_state,b_1,8,a);
            wwCopy(c1,b,0x10);
            zzRedBarr(c1,b_1,8,(word *)combo_state,a);
            bVar2 = wwEq(c1,c,8);
            if (bVar2 == 0) {
              return 0;
            }
            wwCopy(c1,b,0x10);
            zzRedBarr_fast(c1,b_1,8,(word *)combo_state,a);
            bVar2 = wwEq(c1,c,8);
            if (bVar2 == 0) {
              return 0;
            }
            b_1[0] = b_1[0] | 1;
            wwCopy(c,b,0x10);
            zzRed(c,b_1,8,a);
            wwCopy(c1,b,0x10);
            uVar19 = u64NegInv(b_1[0]);
            zzRedMont(c1,b_1,8,uVar19,a);
            wwCopy(local_8d8,c1,8);
            wwSetZero(c1,8);
            zzRed(c1,b_1,8,a);
            bVar2 = wwEq(c1,c,8);
            if (bVar2 == 0) {
              return 0;
            }
            wwCopy(c1,b,0x10);
            uVar19 = u64NegInv(b_1[0]);
            zzRedMont_fast(c1,b_1,8,uVar19,a);
            wwCopy(local_8d8,c1,8);
            wwSetZero(c1,8);
            zzRed(c1,b_1,8,a);
            bVar2 = wwEq(c1,c,8);
            if (bVar2 == 0) {
              return 0;
            }
            wwRepW(b_1 + 1,7,0xffffffffffffffff);
            wwCopy(c,b,0x10);
            zzRed(c,b_1,8,a);
            wwCopy(c1,b,0x10);
            zzRedCrand(c1,b_1,8,a);
            bVar2 = wwEq(c1,c,8);
            if (bVar2 == 0) {
              return 0;
            }
            wwCopy(c1,b,0x10);
            zzRedCrand_fast(c1,b_1,8,a);
            bVar2 = wwEq(c1,c,8);
            if (bVar2 == 0) break;
            wwCopy(c,b,0x10);
            wwCopy(c1,b,0x10);
            uVar19 = u64NegInv(b_1[0]);
            zzRedMont(c,b_1,8,uVar19,a);
            uVar19 = u64NegInv(b_1[0]);
            zzRedCrandMont(c1,b_1,8,uVar19,a);
            bVar2 = wwEq(c1,c,8);
            if (bVar2 == 0) {
              return 0;
            }
            wwCopy(c,b,0x10);
            wwCopy(c1,b,0x10);
            uVar19 = u64NegInv(b_1[0]);
            zzRedMont_fast(c,b_1,8,uVar19,a);
            uVar19 = u64NegInv(b_1[0]);
            zzRedCrandMont_fast(c1,b_1,8,uVar19,a);
            bVar2 = wwEq_fast(c1,c,8);
            if (bVar2 == 0) {
              return 0;
            }
          }
          return 0;
        }
        prngCOMBOStepR(b_1,0x40,r);
        prngCOMBOStepR(b,0x40,r);
        prngCOMBOStepR(c,0x40,r);
        if (b_1[7] == 0) {
          b_1[7] = 0xffffffffffffffff;
        }
        zzMod(b,b,8,b_1,8,a);
        zzMod(c,c,8,b_1,8,a);
        zzAddMod(c1,b,c,b_1,8);
        zzSubMod((word *)combo_state,c1,c,b_1,8);
        bVar2 = wwEq((word *)combo_state,b,8);
        if (bVar2 == 0) {
          return 0;
        }
        zzSubMod((word *)combo_state,c1,b,b_1,8);
        bVar2 = wwEq((word *)combo_state,c,8);
        if (bVar2 == 0) {
          return 0;
        }
        zzAddMod_fast(c1,b,c,b_1,8);
        zzSubMod_fast((word *)combo_state,c1,c,b_1,8);
        bVar2 = wwEq_fast((word *)combo_state,b,8);
        if (bVar2 == 0) {
          return 0;
        }
        zzSubMod_fast((word *)combo_state,c1,b,b_1,8);
        bVar2 = wwEq_fast((word *)combo_state,c,8);
        if (bVar2 == 0) {
          return 0;
        }
        zzAddWMod(c1,b,c[0],b_1,8);
        zzSubWMod((word *)combo_state,c1,c[0],b_1,8);
        bVar2 = wwEq((word *)combo_state,b,8);
        if (bVar2 == 0) {
          return 0;
        }
        zzAddWMod_fast(c1,b,c[0],b_1,8);
        zzSubWMod_fast((word *)combo_state,c1,c[0],b_1,8);
        bVar2 = wwEq_fast((word *)combo_state,b,8);
        if (bVar2 == 0) {
          return 0;
        }
        zzNegMod(c1,b,b_1,8);
        zzAddMod((word *)combo_state,c1,b,b_1,8);
        bVar2 = wwIsZero((word *)combo_state,8);
        if (bVar2 == 0) break;
        zzNegMod((word *)combo_state,(word *)combo_state,b_1,8);
        bVar2 = wwIsZero((word *)combo_state,8);
        if (bVar2 == 0) {
          return 0;
        }
        zzNegMod_fast(c1,b,b_1,8);
        zzAddMod_fast((word *)combo_state,c1,b,b_1,8);
        bVar2 = wwIsZero_fast((word *)combo_state,8);
        if (bVar2 == 0) {
          return 0;
        }
        zzNegMod_fast((word *)combo_state,(word *)combo_state,b_1,8);
        bVar2 = wwIsZero_fast((word *)combo_state,8);
        if (bVar2 == 0) {
          return 0;
        }
        b_1[0] = b_1[0] | 1;
        zzHalfMod(c1,b,b_1,8);
        zzDoubleMod((word *)combo_state,c1,b_1,8);
        bVar2 = wwEq((word *)combo_state,b,8);
        if (bVar2 == 0) {
          return 0;
        }
        zzHalfMod_fast(c1,b,b_1,8);
        zzDoubleMod_fast((word *)combo_state,c1,b_1,8);
        bVar2 = wwEq_fast((word *)combo_state,b,8);
        if (bVar2 == 0) {
          return 0;
        }
        zzMulMod(c1,b,b,b_1,8,a);
        zzSqrMod((word *)combo_state,b,b_1,8,a);
        bVar2 = wwEq(c1,(word *)combo_state,8);
        if (bVar2 == 0) {
          return 0;
        }
        iVar5 = zzJacobi((word *)combo_state,8,b_1,8,a);
        if (iVar5 == -1) {
          return 0;
        }
        zzGCD(c1,b,8,b_1,8,a);
        iVar5 = wwCmpW(c1,8,1);
        if (iVar5 == 0) {
          bVar2 = zzIsCoprime(b,8,b_1,8,a);
          if (bVar2 == 0) {
            return 0;
          }
          zzInvMod(c1,b,b_1,8,a);
          zzMulMod(c1,c1,c,b_1,8,a);
          zzDivMod((word *)combo_state,c,b,b_1,8,a);
          bVar2 = wwEq(c1,(word *)combo_state,8);
          if (bVar2 == 0) {
            return 0;
          }
          zzMulMod((word *)combo_state,(word *)combo_state,b,b_1,8,a);
          bVar2 = wwEq((word *)combo_state,c,8);
          if (bVar2 == 0) {
            return 0;
          }
          wwSetZero(c + 1,7);
          zzMulWMod(c1,b,c[0],b_1,8,a);
          zzMulMod((word *)combo_state,b,c,b_1,8,a);
          bVar2 = wwEq(c1,(word *)combo_state,8);
          if (bVar2 == 0) {
            return 0;
          }
          sVar6 = zzAlmostInvMod(c1,b,b_1,8,a);
          while (bVar23 = sVar6 != 0, sVar6 = sVar6 - 1, bVar23) {
            zzHalfMod(c1,c1,b_1,8);
          }
          zzInvMod((word *)combo_state,b,b_1,8,a);
          bVar2 = wwEq(c1,(word *)combo_state,8);
          if (bVar2 == 0) {
            return 0;
          }
        }
      }
      return 0;
    }
    prngCOMBOStepR(a,0x40,combo_state);
    prngCOMBOStepR(b,0x40,combo_state);
    wVar7 = zzAdd(c,a,b,8);
    wVar8 = zzSub(c1,c,b,8);
    if (wVar8 != wVar7) {
      return 0;
    }
    bVar2 = wwEq(c1,a,8);
    if (bVar2 == 0) {
      return 0;
    }
    uVar3 = zzIsSumEq(c,a,b,8);
    if (uVar3 != (wVar7 == 0)) {
      return 0;
    }
    uVar4 = zzIsSumEq_fast(c,a,b,8);
    if (uVar4 != uVar3) {
      return 0;
    }
    wwCopy(c1,a,8);
    wVar8 = zzAdd2(c1,b,8);
    if (wVar8 != wVar7) {
      return 0;
    }
    bVar2 = wwEq(c1,c,8);
    if (bVar2 == 0) {
      return 0;
    }
    wVar8 = zzSub2(c1,b,8);
    if (wVar8 != wVar7) {
      return 0;
    }
    bVar2 = wwEq(c1,a,8);
    if (bVar2 == 0) {
      return 0;
    }
    wVar7 = zzAddW(c,a,8,b[0]);
    wVar8 = zzSubW(c1,c,8,b[0]);
    if (wVar8 != wVar7) {
      return 0;
    }
    bVar2 = wwEq(c1,a,8);
    if (bVar2 == 0) {
      return 0;
    }
    uVar3 = zzIsSumWEq(c,a,8,b[0]);
    if (uVar3 != (wVar7 == 0)) {
      return 0;
    }
    uVar4 = zzIsSumWEq_fast(c,a,8,b[0]);
    if (uVar4 != uVar3) {
      return 0;
    }
    wwCopy(c1,a,8);
    wVar8 = zzAddW2(c1,8,b[0]);
    if (wVar8 != wVar7) {
      return 0;
    }
    bVar2 = wwEq(c1,c,8);
    if (bVar2 == 0) {
      return 0;
    }
    wVar8 = zzSubW2(c1,8,b[0]);
    if (wVar8 != wVar7) {
      return 0;
    }
    bVar2 = wwEq(c1,a,8);
    if (bVar2 == 0) {
      return 0;
    }
    wVar7 = zzAddW(c,a,1,b[0]);
    wVar8 = zzSubW(c1,c,1,b[0]);
    if (wVar8 != wVar7) {
      return 0;
    }
    bVar2 = wwEq(c1,a,1);
    if (bVar2 == 0) {
      return 0;
    }
    uVar3 = zzIsSumWEq(c,a,1,b[0]);
    if (uVar3 != (wVar7 == 0)) {
      return 0;
    }
    uVar4 = zzIsSumWEq_fast(c,a,1,b[0]);
    if (uVar4 != uVar3) {
      return 0;
    }
    wVar7 = zzAdd(c,a,b,8);
    wVar8 = zzAdd3(c1,a,8,b,8);
    if (wVar8 != wVar7) {
      return 0;
    }
    bVar2 = wwEq(c1,c,8);
    if (bVar2 == 0) {
      return 0;
    }
    b[7] = 0;
    wVar7 = zzAdd(c,a,b,8);
    wVar8 = zzAdd3(c1,a,8,b,7);
    if (wVar8 != wVar7) {
      return 0;
    }
    bVar2 = wwEq(c1,c,8);
    if (bVar2 == 0) break;
    wVar8 = zzAdd3(c1,b,7,a,8);
    if (wVar8 != wVar7) {
      return 0;
    }
    bVar2 = wwEq(c1,c,8);
    if (bVar2 == 0) {
      return 0;
    }
    zzNeg(b,a,8);
    wVar7 = zzAdd(c,a,b,8);
    if (wVar7 != 1) {
      return 0;
    }
    bVar2 = wwIsZero(c,8);
    if (bVar2 == 0) {
      return 0;
    }
  }
  return 0;
}

Assistant:

bool_t zzTest()
{
	return zzTestAdd() && 
		zzTestMul() && 
		zzTestMod() && 
		zzTestGCD() && 
		zzTestRed() &&
		zzTestEtc();
}